

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O1

void __thiscall
utObjImportExport_import_with_line_continuations_Test::TestBody
          (utObjImportExport_import_with_line_continuations_Test *this)

{
  bool bVar1;
  aiScene *val1;
  char *pcVar2;
  AssertionResult gtest_ar;
  aiScene *scene;
  Importer myImporter;
  char *in_stack_ffffffffffffffb8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  undefined4 uVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  expr1;
  AssertHelper local_38;
  internal in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  Importer local_18;
  
  Assimp::Importer::Importer(&local_18);
  pcVar2 = "";
  val1 = Assimp::Importer::ReadFileFromMemory
                   (&local_18,
                    "v -0.5 -0.5 0.5\nv -0.5 \\\n  -0.5 -0.5\nv -0.5 \\\n   0.5 \\\n   -0.5\nf 1 2 3\n"
                    ,0x47,0,"");
  sVar3.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&stack0xffffffffffffffd0,"nullptr","scene",
             (void **)&stack0xffffffffffffffc0,(aiScene **)&stack0xffffffffffffffe0);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (sVar3.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (sVar3.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)sVar3.ptr_ + 8))();
      }
      sVar3.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  uVar5 = (undefined4)((ulong)sVar3.ptr_ >> 0x20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar3.ptr_._4_4_ = uVar5;
  sVar3.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&stack0xffffffffffffffd0,"scene->mNumMeshes","1U",&val1->mNumMeshes,
             (uint *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (sVar3.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (sVar3.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)sVar3.ptr_ + 8))();
      }
      sVar3.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  uVar5 = (undefined4)((ulong)sVar3.ptr_ >> 0x20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar4.ptr_._4_4_ = uVar5;
  sVar4.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&stack0xffffffffffffffd0,"scene->mMeshes[0]->mNumVertices","3U",
             &(*val1->mMeshes)->mNumVertices,(uint *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1d3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (sVar4.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (sVar4.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)sVar4.ptr_ + 8))();
      }
      sVar4.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  uVar5 = (undefined4)((ulong)sVar4.ptr_ >> 0x20);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  expr1.ptr_._4_4_ = uVar5;
  expr1.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&stack0xffffffffffffffd0,"scene->mMeshes[0]->mNumFaces","1U",
             &(*val1->mMeshes)->mNumFaces,(uint *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1d4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x36ffe0,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1d9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x3700b1,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x370182,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x370253,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1dd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x370324,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1de,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x3703f5,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x3704c6,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1e1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x370597,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1e2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)expr1.ptr_ + 8))();
      }
      expr1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::DoubleNearPredFormat
            ((char *)expr1.ptr_,in_stack_ffffffffffffffb8,(char *)0x370668,(double)val1,
             (double)in_stack_ffffffffffffffd8.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
  if (in_stack_ffffffffffffffd0 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffffd8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((in_stack_ffffffffffffffd8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (((expr1.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (expr1.ptr_ != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       )) {
      (**(code **)(*(long *)expr1.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffd8,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::Importer::~Importer(&local_18);
  return;
}

Assistant:

TEST_F(utObjImportExport, import_with_line_continuations) {
    static const char *ObjModel =
        "v -0.5 -0.5 0.5\n"
        "v -0.5 \\\n"
        "  -0.5 -0.5\n"
        "v -0.5 \\\n"
        "   0.5 \\\n"
        "   -0.5\n"
        "f 1 2 3\n";

    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), 0);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 3U);
    EXPECT_EQ(scene->mMeshes[0]->mNumFaces, 1U);

    auto vertices = scene->mMeshes[0]->mVertices;
    const float threshold = 0.0001f;

    EXPECT_NEAR(vertices[0].x, -0.5f, threshold);
    EXPECT_NEAR(vertices[0].y, -0.5f, threshold);
    EXPECT_NEAR(vertices[0].z, 0.5f, threshold);

    EXPECT_NEAR(vertices[1].x, -0.5f, threshold);
    EXPECT_NEAR(vertices[1].y, -0.5f, threshold);
    EXPECT_NEAR(vertices[1].z, -0.5f, threshold);

    EXPECT_NEAR(vertices[2].x, -0.5f, threshold);
    EXPECT_NEAR(vertices[2].y, 0.5f, threshold);
    EXPECT_NEAR(vertices[2].z, -0.5f, threshold);
}